

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O1

Literals * __thiscall
wasm::ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::callFunctionInternal
          (Literals *__return_storage_ptr__,
          ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *this,Name name,
          Literals *arguments)

{
  Type *__x;
  pointer *ppNVar1;
  iterator __position;
  char cVar2;
  Function *function;
  pointer pNVar3;
  ostream *poVar4;
  ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *pMVar5;
  ulong uVar6;
  Type extraout_RDX;
  Type extraout_RDX_00;
  ulong uVar7;
  Name name_00;
  Name NVar8;
  undefined1 local_e0 [8];
  FunctionScope scope;
  Flow flow;
  undefined1 auStack_50 [8];
  Name name_local;
  char local_31;
  
  name_local.super_IString.str._M_len = name.super_IString.str._M_str;
  auStack_50 = name.super_IString.str._M_len;
  if (0xfa < this->callDepth) {
    (*this->externalInterface->_vptr_ExternalInterface[8])(this->externalInterface,"stack limit");
  }
  flow.breakTo.super_IString.str._M_str = (char *)this->callDepth;
  __position._M_current =
       (this->functionStack).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
       super__Vector_impl_data._M_finish;
  this->callDepth = (size_t)(flow.breakTo.super_IString.str._M_str + 1);
  uVar7 = (long)__position._M_current -
          (long)(this->functionStack).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
                _M_impl.super__Vector_impl_data._M_start;
  if (__position._M_current ==
      (this->functionStack).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<wasm::Name,std::allocator<wasm::Name>>::_M_realloc_insert<wasm::Name_const&>
              ((vector<wasm::Name,std::allocator<wasm::Name>> *)&this->functionStack,__position,
               (Name *)auStack_50);
  }
  else {
    ((__position._M_current)->super_IString).str._M_len = (size_t)auStack_50;
    ((__position._M_current)->super_IString).str._M_str =
         (char *)name_local.super_IString.str._M_len;
    ppNVar1 = &(this->functionStack).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    *ppNVar1 = *ppNVar1 + 1;
  }
  NVar8.super_IString.str._M_str = (char *)auStack_50;
  NVar8.super_IString.str._M_len = (size_t)this->wasm;
  function = (Function *)wasm::Module::getFunction(NVar8);
  if (function != (Function *)0x0) {
    pMVar5 = this;
    FunctionScope::FunctionScope
              ((FunctionScope *)local_e0,function,arguments,(EvallingModuleRunner *)this);
    ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::visit
              ((Flow *)&scope.currDelegateTarget.super_IString.str._M_str,
               &this->super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>,
               function->body);
    if ((flow.breakTo.super_IString.str._M_len != 0) &&
       (pMVar5 = (ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)&RETURN_FLOW,
       flow.breakTo.super_IString.str._M_len != _getStruct)) {
      __assert_fail("!flow.breaking() || flow.breakTo == RETURN_FLOW",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-interpreter.h"
                    ,0xf05,
                    "Literals wasm::ModuleRunnerBase<(anonymous namespace)::EvallingModuleRunner>::callFunctionInternal(Name, const Literals &) [SubType = (anonymous namespace)::EvallingModuleRunner]"
                   );
    }
    name_local.super_IString.str._M_str =
         (char *)Literals::getType((Literals *)&scope.currDelegateTarget.super_IString.str._M_str);
    wasm::HeapType::getSignature();
    cVar2 = wasm::Type::isSubType((Type)name_local.super_IString.str._M_str,extraout_RDX);
    if (cVar2 != '\0') {
      this->callDepth = (size_t)flow.breakTo.super_IString.str._M_str;
      pNVar3 = (this->functionStack).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      uVar6 = (long)pNVar3 -
              (long)(this->functionStack).
                    super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                    super__Vector_impl_data._M_start;
      if (uVar7 < uVar6) {
        do {
          pNVar3 = pNVar3 + -1;
          uVar6 = uVar6 - 0x10;
        } while (uVar7 < uVar6);
        (this->functionStack).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
        super__Vector_impl_data._M_finish = pNVar3;
      }
      (__return_storage_ptr__->super_SmallVector<wasm::Literal,_1UL>).usedFixed =
           (size_t)scope.currDelegateTarget.super_IString.str._M_str;
      wasm::Literal::Literal
                ((__return_storage_ptr__->super_SmallVector<wasm::Literal,_1UL>).fixed._M_elems,
                 (Literal *)&flow);
      __x = &flow.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type;
      std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::vector
                (&(__return_storage_ptr__->super_SmallVector<wasm::Literal,_1UL>).flexible,
                 (vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)__x);
      std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
                ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)__x);
      wasm::Literal::~Literal((Literal *)&flow);
      *(EvallingModuleRunner **)&((scope.function)->debugLocations)._M_h._M_rehash_policy =
           scope.parent;
      std::vector<wasm::Literals,_std::allocator<wasm::Literals>_>::~vector
                ((vector<wasm::Literals,_std::allocator<wasm::Literals>_> *)local_e0);
      return __return_storage_ptr__;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"calling ",8);
    name_00.super_IString.str._M_str = (char *)pMVar5;
    name_00.super_IString.str._M_len =
         (size_t)(function->super_Importable).super_Named.name.super_IString.str._M_str;
    poVar4 = operator<<((wasm *)&std::cerr,
                        (ostream *)
                        (function->super_Importable).super_Named.name.super_IString.str._M_len,
                        name_00);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," resulted in ",0xd);
    poVar4 = (ostream *)wasm::operator<<(poVar4,(Type)name_local.super_IString.str._M_str);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," but the function type is ",0x1a);
    wasm::HeapType::getSignature();
    poVar4 = (ostream *)wasm::operator<<(poVar4,extraout_RDX_00);
    local_31 = '\n';
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,&local_31,1);
    wasm::handle_unreachable
              ("unexpected result type",
               "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-interpreter.h"
               ,0xf0b);
  }
  __assert_fail("function",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-interpreter.h"
                ,0xef9,
                "Literals wasm::ModuleRunnerBase<(anonymous namespace)::EvallingModuleRunner>::callFunctionInternal(Name, const Literals &) [SubType = (anonymous namespace)::EvallingModuleRunner]"
               );
}

Assistant:

Literals callFunctionInternal(Name name, const Literals& arguments) {
    if (callDepth > maxDepth) {
      externalInterface->trap("stack limit");
    }
    auto previousCallDepth = callDepth;
    callDepth++;
    auto previousFunctionStackSize = functionStack.size();
    functionStack.push_back(name);

    Function* function = wasm.getFunction(name);
    assert(function);
    FunctionScope scope(function, arguments, *self());

#ifdef WASM_INTERPRETER_DEBUG
    std::cout << "entering " << function->name << "\n  with arguments:\n";
    for (unsigned i = 0; i < arguments.size(); ++i) {
      std::cout << "    $" << i << ": " << arguments[i] << '\n';
    }
#endif

    Flow flow = self()->visit(function->body);
    // cannot still be breaking, it means we missed our stop
    assert(!flow.breaking() || flow.breakTo == RETURN_FLOW);
    auto type = flow.getType();
    if (!Type::isSubType(type, function->getResults())) {
      std::cerr << "calling " << function->name << " resulted in " << type
                << " but the function type is " << function->getResults()
                << '\n';
      WASM_UNREACHABLE("unexpected result type");
    }
    // may decrease more than one, if we jumped up the stack
    callDepth = previousCallDepth;
    // if we jumped up the stack, we also need to pop higher frames
    // TODO can FunctionScope handle this automatically?
    while (functionStack.size() > previousFunctionStackSize) {
      functionStack.pop_back();
    }
#ifdef WASM_INTERPRETER_DEBUG
    std::cout << "exiting " << function->name << " with " << flow.values
              << '\n';
#endif
    return flow.values;
  }